

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# REFPROP_lib.h
# Opt level: O0

bool load_REFPROP(string *err,string *shared_library_path,string *shared_library_name)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  undefined8 uVar4;
  char local_538 [8];
  char rpv [1000];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  char *local_a0;
  char *errstr;
  undefined1 local_68 [8];
  string shared_lib;
  string msg;
  string *shared_library_name_local;
  string *shared_library_path_local;
  string *err_local;
  
  if (RefpropdllInstance == (void *)0x0) {
    std::__cxx11::string::string((string *)(shared_lib.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_68);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator=((string *)local_68,(string *)shared_library_name);
    }
    else {
      psVar3 = get_shared_lib_abi_cxx11_();
      std::__cxx11::string::operator=((string *)local_68,(string *)psVar3);
    }
    RP_join_path((string *)&errstr,shared_library_path,(string *)local_68);
    uVar4 = std::__cxx11::string::c_str();
    RefpropdllInstance = (void *)dlopen(uVar4);
    std::__cxx11::string::~string((string *)&errstr);
    if (RefpropdllInstance == (void *)0x0) {
      local_a0 = (char *)dlerror();
      if (local_a0 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)(shared_lib.field_2._M_local_buf + 8),local_a0);
      }
    }
    else {
      RP_join_path(&local_c0,shared_library_path,(string *)local_68);
      std::__cxx11::string::operator=((string *)&RPPath_loaded_abi_cxx11_,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if (RefpropdllInstance == (void *)0x0) {
      std::operator+(&local_140,"Could not load REFPROP (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      std::operator+(&local_120,&local_140,") due to: ");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&shared_lib.field_2 + 8));
      std::operator+(&local_e0,&local_100,". ");
      std::__cxx11::string::operator=((string *)err,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::append((char *)err);
      std::__cxx11::string::append((char *)err);
      err_local._7_1_ = false;
    }
    else {
      bVar1 = setFunctionPointers(err);
      if (bVar1) {
        memset(local_538,0,1000);
        (*(code *)RPVersion)(local_538,1000);
        std::__cxx11::string::operator=((string *)&RPVersion_loaded_abi_cxx11_,local_538);
        err_local._7_1_ = true;
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)err,
                   "There was an error setting the REFPROP function pointers, check types and names in header file."
                  );
        err_local._7_1_ = false;
      }
    }
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(shared_lib.field_2._M_local_buf + 8));
  }
  else {
    err_local._7_1_ = true;
  }
  return err_local._7_1_;
}

Assistant:

bool load_REFPROP(std::string &err, const std::string &shared_library_path, const std::string &shared_library_name)
    {
        // If REFPROP is not loaded
        if (RefpropdllInstance == NULL)
        {
            // Load it
            std::string msg;
            std::string shared_lib;
            if (shared_library_name.empty()) 
            {
                shared_lib = get_shared_lib();
            } else {
                shared_lib = shared_library_name;
            }
            #if defined(__RPISWINDOWS__)
                // Load the DLL
                TCHAR refpropdllstring[_MAX_PATH];
                strcpy((char*)refpropdllstring, RP_join_path(shared_library_path, shared_lib).c_str());
                RefpropdllInstance = LoadLibrary(refpropdllstring);
                // Error handling
                if (RefpropdllInstance == NULL)
                {
                    std::stringstream msg_stream;
                    msg_stream << GetLastError(); // returns error
                    msg = msg_stream.str();
                } else {
                    TCHAR dllPath[_MAX_PATH];
                    HMODULE hModule;
                    hModule = GetModuleHandle(refpropdllstring);
                    GetModuleFileName(hModule, dllPath, _MAX_PATH);
                    #ifndef UNICODE
                        msg = dllPath;
                    #else
                        std::wstring wStr = dllPath;
                        msg = std::string(wStr.begin(), wStr.end());
                    #endif
                    RPPath_loaded = msg;
                }
            #elif ( defined(__RPISLINUX__) || defined(__RPISAPPLE__) )
                // Load library
                RefpropdllInstance = dlopen (RP_join_path(shared_library_path, shared_lib).c_str(), RTLD_NOW); 
                // Error handling
                if (RefpropdllInstance == NULL) 
                {
                    const char *errstr = dlerror();
                    if (errstr != NULL) 
                    {
                        msg = errstr;
                    }
                } else {
                    RPPath_loaded = RP_join_path(shared_library_path, shared_lib);
                }
            #else
                RefpropdllInstance = NULL;
                RPPath_loaded = "";
                msg = "Something is wrong with the platform definition, you should not end up here.";
            #endif

            if (RefpropdllInstance == NULL)
            {
                err = "Could not load REFPROP (" + shared_lib + ") due to: " + msg + ". ";
                err.append("Make sure the library is in your system search path. ");
                err.append("In case you run 64bit Windows and you have a REFPROP license, try installing the 64bit DLL from NIST. ");
                return false;
            }
            if (setFunctionPointers(err) != true)
            {
                err = "There was an error setting the REFPROP function pointers, check types and names in header file.";
                return false;
            }
            char rpv[versionstringlength] = { '\0' };
            RPVersion(rpv, versionstringlength);
            RPVersion_loaded = rpv;
            return true;
        }
        return true;
    }